

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O1

void test_decimal128_from_string__zeros(void)

{
  char *suite;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bson_decimal128_t negative_zero;
  bson_decimal128_t large_exponent;
  bson_decimal128_t exponent_zero;
  bson_decimal128_t zero;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  char local_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char cStack_11;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  char cStack_c;
  char cStack_b;
  char cStack_a;
  char cStack_9;
  
  bson_decimal128_from_string("0",&local_18);
  bson_decimal128_from_string("0e-611",&local_28);
  bson_decimal128_from_string("0e+6000",&local_38);
  suite = "-0e-1";
  bson_decimal128_from_string("-0e-1",&local_48);
  auVar1[0] = -(local_18 == '\0');
  auVar1[1] = -(cStack_17 == '\0');
  auVar1[2] = -(cStack_16 == '\0');
  auVar1[3] = -(cStack_15 == '\0');
  auVar1[4] = -(cStack_14 == '\0');
  auVar1[5] = -(cStack_13 == '\0');
  auVar1[6] = -(cStack_12 == '\0');
  auVar1[7] = -(cStack_11 == '\0');
  auVar1[8] = -(cStack_10 == '\0');
  auVar1[9] = -(cStack_f == '\0');
  auVar1[10] = -(cStack_e == '\0');
  auVar1[0xb] = -(cStack_d == '\0');
  auVar1[0xc] = -(cStack_c == '\0');
  auVar1[0xd] = -(cStack_b == '\0');
  auVar1[0xe] = -(cStack_a == '@');
  auVar1[0xf] = -(cStack_9 == '0');
  if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(auVar1[0xf] >> 7) << 0xf) ==
      0xffff) {
    auVar2[0] = -(local_28 == '\0');
    auVar2[1] = -(cStack_27 == '\0');
    auVar2[2] = -(cStack_26 == '\0');
    auVar2[3] = -(cStack_25 == '\0');
    auVar2[4] = -(cStack_24 == '\0');
    auVar2[5] = -(cStack_23 == '\0');
    auVar2[6] = -(cStack_22 == '\0');
    auVar2[7] = -(cStack_21 == '\0');
    auVar2[8] = -(cStack_20 == '\0');
    auVar2[9] = -(cStack_1f == '\0');
    auVar2[10] = -(cStack_1e == '\0');
    auVar2[0xb] = -(cStack_1d == '\0');
    auVar2[0xc] = -(cStack_1c == '\0');
    auVar2[0xd] = -(cStack_1b == '\0');
    auVar2[0xe] = -(cStack_1a == 'z');
    auVar2[0xf] = -(cStack_19 == '+');
    if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(auVar2[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128f91;
    auVar3[0] = -(local_38 == '\0');
    auVar3[1] = -(cStack_37 == '\0');
    auVar3[2] = -(cStack_36 == '\0');
    auVar3[3] = -(cStack_35 == '\0');
    auVar3[4] = -(cStack_34 == '\0');
    auVar3[5] = -(cStack_33 == '\0');
    auVar3[6] = -(cStack_32 == '\0');
    auVar3[7] = -(cStack_31 == '\0');
    auVar3[8] = -(cStack_30 == '\0');
    auVar3[9] = -(cStack_2f == '\0');
    auVar3[10] = -(cStack_2e == '\0');
    auVar3[0xb] = -(cStack_2d == '\0');
    auVar3[0xc] = -(cStack_2c == '\0');
    auVar3[0xd] = -(cStack_2b == '\0');
    auVar3[0xe] = -(cStack_2a == ' ');
    auVar3[0xf] = -(cStack_29 == '_');
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf)
        == 0xffff) {
      auVar4[0] = -(local_48 == '\0');
      auVar4[1] = -(cStack_47 == '\0');
      auVar4[2] = -(cStack_46 == '\0');
      auVar4[3] = -(cStack_45 == '\0');
      auVar4[4] = -(cStack_44 == '\0');
      auVar4[5] = -(cStack_43 == '\0');
      auVar4[6] = -(cStack_42 == '\0');
      auVar4[7] = -(cStack_41 == '\0');
      auVar4[8] = -(cStack_40 == '\0');
      auVar4[9] = -(cStack_3f == '\0');
      auVar4[10] = -(cStack_3e == '\0');
      auVar4[0xb] = -(cStack_3d == '\0');
      auVar4[0xc] = -(cStack_3c == '\0');
      auVar4[0xd] = -(cStack_3b == '\0');
      auVar4[0xe] = -(cStack_3a == '>');
      auVar4[0xf] = -(cStack_39 == -0x50);
      if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        return;
      }
      goto LAB_00128f9b;
    }
  }
  else {
    test_decimal128_from_string__zeros_cold_1();
LAB_00128f91:
    test_decimal128_from_string__zeros_cold_2();
  }
  test_decimal128_from_string__zeros_cold_3();
LAB_00128f9b:
  test_decimal128_from_string__zeros_cold_4();
  TestSuite_Add((TestSuite *)suite,"/bson/error/basic",test_bson_error_basic);
  return;
}

Assistant:

static void
test_decimal128_from_string__zeros (void)
{
   bson_decimal128_t zero;
   bson_decimal128_t exponent_zero;
   bson_decimal128_t large_exponent;
   bson_decimal128_t negative_zero;

   bson_decimal128_from_string ("0", &zero);
   bson_decimal128_from_string ("0e-611", &exponent_zero);
   bson_decimal128_from_string ("0e+6000", &large_exponent);
   bson_decimal128_from_string ("-0e-1", &negative_zero);

   BSON_ASSERT (decimal128_equal (&zero, 0x3040000000000000, 0x0000000000000000));
   BSON_ASSERT (decimal128_equal (
      &exponent_zero, 0x2b7a000000000000, 0x0000000000000000));
   BSON_ASSERT (decimal128_equal (
      &large_exponent, 0x5f20000000000000, 0x0000000000000000));
   BSON_ASSERT (decimal128_equal (
      &negative_zero, 0xb03e000000000000, 0x0000000000000000));
}